

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.hh
# Opt level: O1

void __thiscall tinyusdz::GeomPrimvar::GeomPrimvar(GeomPrimvar *this,GeomPrimvar *rhs)

{
  bool bVar1;
  bool bVar2;
  
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  this->_has_value = false;
  Attribute::Attribute(&this->_attr);
  (this->_unauthoredValuesIndex).has_value_ = false;
  (this->_unauthoredValuesIndex).contained = (storage_t<int>)0x0;
  (this->_elementSize).has_value_ = false;
  (this->_elementSize).contained = (storage_t<unsigned_int>)0x0;
  (this->_interpolation).has_value_ = false;
  (this->_interpolation).contained = (storage_t<tinyusdz::Interpolation>)0x0;
  (this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->_ts_indices)._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_ts_indices)._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_ts_indices)._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_ts_indices)._dirty = false;
  ::std::__cxx11::string::_M_assign((string *)this);
  ::std::__cxx11::string::_M_assign((string *)&this->_attr);
  (this->_attr)._varying_authored = (rhs->_attr)._varying_authored;
  (this->_attr)._variability = (rhs->_attr)._variability;
  ::std::__cxx11::string::_M_assign((string *)&(this->_attr)._type_name);
  linb::any::operator=((any *)&(this->_attr)._var,(any *)&(rhs->_attr)._var);
  (this->_attr)._var._blocked = (rhs->_attr)._var._blocked;
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)&(this->_attr)._var._ts,
              (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)&(rhs->_attr)._var._ts);
  (this->_attr)._var._ts._dirty = (rhs->_attr)._var._ts._dirty;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
            (&(this->_attr)._paths,&(rhs->_attr)._paths);
  AttrMetas::operator=(&(this->_attr)._metas,&(rhs->_attr)._metas);
  ::std::vector<int,_std::allocator<int>_>::operator=(&this->_indices,&rhs->_indices);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ::operator=(&(this->_ts_indices)._samples,&(rhs->_ts_indices)._samples);
  (this->_ts_indices)._dirty = (rhs->_ts_indices)._dirty;
  this->_has_value = rhs->_has_value;
  if (((rhs->_elementSize).has_value_ == true) &&
     ((this->_elementSize).contained = (rhs->_elementSize).contained,
     (this->_elementSize).has_value_ == false)) {
    (this->_elementSize).has_value_ = true;
  }
  if (((rhs->_interpolation).has_value_ == true) &&
     ((this->_interpolation).contained = (rhs->_interpolation).contained,
     (this->_interpolation).has_value_ == false)) {
    (this->_interpolation).has_value_ = true;
  }
  bVar1 = (this->_unauthoredValuesIndex).has_value_;
  bVar2 = (rhs->_unauthoredValuesIndex).has_value_;
  if (bVar1 == true) {
    if (bVar2 == false) {
      (this->_unauthoredValuesIndex).has_value_ = false;
      return;
    }
  }
  else {
    if (bVar2 != false) {
      (this->_unauthoredValuesIndex).contained = (rhs->_unauthoredValuesIndex).contained;
      (this->_unauthoredValuesIndex).has_value_ = true;
      return;
    }
    if (bVar1 == false) {
      return;
    }
  }
  if ((rhs->_unauthoredValuesIndex).has_value_ == true) {
    (this->_unauthoredValuesIndex).contained = (rhs->_unauthoredValuesIndex).contained;
  }
  return;
}

Assistant:

GeomPrimvar(const GeomPrimvar &rhs) {
    _name = rhs._name;
    _attr = rhs._attr;
    _indices = rhs._indices;
    _ts_indices = rhs._ts_indices;
    _has_value = rhs._has_value;
    if (rhs._elementSize) {
      _elementSize = rhs._elementSize;
    }

    if (rhs._interpolation) {
      _interpolation = rhs._interpolation;
    }
    _unauthoredValuesIndex = rhs._unauthoredValuesIndex;
  }